

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool bitset_array_container_ixor
                (bitset_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  int iVar2;
  uint64_t *puVar3;
  uint16_t *puVar4;
  ulong uVar5;
  array_container_t *paVar6;
  long lVar7;
  int32_t iVar8;
  
  *dst = src_1;
  iVar8 = src_1->cardinality;
  iVar2 = src_2->cardinality;
  if ((long)iVar2 != 0) {
    puVar3 = src_1->words;
    puVar4 = src_2->array;
    lVar7 = 0;
    do {
      uVar1 = *(ushort *)((long)puVar4 + lVar7);
      uVar5 = puVar3[uVar1 >> 6];
      iVar8 = (iVar8 - ((int)(uVar5 >> ((byte)uVar1 & 0x3f)) * 2 & 2U)) + 1;
      puVar3[uVar1 >> 6] = uVar5 ^ 1L << ((ulong)uVar1 & 0x3f);
      lVar7 = lVar7 + 2;
    } while ((long)iVar2 * 2 != lVar7);
  }
  src_1->cardinality = iVar8;
  if (iVar8 < 0x1001) {
    paVar6 = array_container_from_bitset(src_1);
    *dst = paVar6;
    bitset_container_free(src_1);
  }
  return 0x1000 < iVar8;
}

Assistant:

bool bitset_array_container_ixor(
    bitset_container_t *src_1, const array_container_t *src_2,
    container_t **dst
){
    *dst = src_1;
    src_1->cardinality = (uint32_t)bitset_flip_list_withcard(
        src_1->words, src_1->cardinality, src_2->array, src_2->cardinality);

    if (src_1->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(src_1);
        bitset_container_free(src_1);
        return false;  // not bitset
    } else
        return true;
}